

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

int MeCab::load_request_type(Param *param)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  bVar1 = Param::get<bool>(param,"allocate-sentence");
  bVar2 = Param::get<bool>(param,"partial");
  bVar3 = Param::get<bool>(param,"all-morphs");
  uVar6 = (uint)bVar3 << 5 | (uint)bVar1 * 0x40 + (uint)bVar2 * 4;
  bVar1 = Param::get<bool>(param,"marginal");
  iVar4 = Param::get<int>(param,"nbest");
  uVar7 = uVar6 + (uint)bVar1 * 8 + 3;
  iVar5 = Param::get<int>(param,"lattice-level");
  uVar6 = uVar6 + (uint)bVar1 * 8 + 1;
  if (0 < iVar5) {
    uVar6 = uVar7;
  }
  if (1 < iVar4) {
    uVar6 = uVar7;
  }
  uVar7 = uVar6 | 8;
  if (iVar5 < 2) {
    uVar7 = uVar6;
  }
  return uVar7;
}

Assistant:

int load_request_type(const Param &param) {
  int request_type = MECAB_ONE_BEST;

  if (param.get<bool>("allocate-sentence")) {
    request_type |= MECAB_ALLOCATE_SENTENCE;
  }

  if (param.get<bool>("partial")) {
    request_type |= MECAB_PARTIAL;
  }

  if (param.get<bool>("all-morphs")) {
    request_type |= MECAB_ALL_MORPHS;
  }

  if (param.get<bool>("marginal")) {
    request_type |= MECAB_MARGINAL_PROB;
  }

  const int nbest = param.get<int>("nbest");
  if (nbest >= 2) {
    request_type |= MECAB_NBEST;
  }

  // DEPRECATED:
  const int lattice_level = param.get<int>("lattice-level");
  if (lattice_level >= 1) {
    request_type |= MECAB_NBEST;
  }

  if (lattice_level >= 2) {
    request_type |= MECAB_MARGINAL_PROB;
  }

  return request_type;
}